

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OddImageSizes.c
# Opt level: O2

void draw(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,IceTFloat *background_color,
         IceTInt *readback_viewport,IceTImage result)

{
  IceTFloat *pIVar1;
  double dVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined6 uVar13;
  undefined8 uVar14;
  unkbyte10 Var15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  short sVar18;
  undefined4 uVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  byte bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  IceTInt IVar27;
  IceTBoolean IVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  double *pdVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  IceTFloat IVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  char cVar47;
  undefined1 uVar48;
  char cVar49;
  char cVar50;
  IceTFloat IVar51;
  IceTFloat IVar52;
  float fVar53;
  IceTFloat IVar54;
  double dVar55;
  IceTFloat IVar56;
  IceTInt screen_height;
  IceTInt screen_width;
  IceTFloat *local_2f8;
  IceTFloat *local_2f0;
  IceTUByte *local_2e8;
  IceTFloat *local_2e0;
  double local_2d8;
  double local_2d0;
  undefined1 local_2c8 [16];
  hexahedron transformed_box;
  IceTDouble inverse_transpose_transform [16];
  double local_178 [24];
  IceTDouble transform [16];
  char cVar4;
  char cVar5;
  char cVar6;
  
  local_2e0 = background_color;
  icetMatrixMultiply(transform,projection_matrix,modelview_matrix);
  IVar28 = icetMatrixInverseTranspose(transform,inverse_transpose_transform);
  if (IVar28 == '\0') {
    puts("ERROR: Inverse failed.");
  }
  for (lVar37 = 0; lVar37 != 0xc0; lVar37 = lVar37 + 0x20) {
    icetMatrixVectorMultiply
              ((IceTDouble *)((long)transformed_box.planes[0] + lVar37),inverse_transpose_transform,
               (IceTDouble *)((long)unit_box.planes[0] + lVar37));
  }
  icetGetIntegerv(7,&screen_width);
  icetGetIntegerv(8,&screen_height);
  if (g_transparent == 1) {
    local_2f8 = icetImageGetColorf(result);
    local_2f0 = (IceTFloat *)0x0;
    local_2e8 = (IceTUByte *)0x0;
  }
  else {
    local_2e8 = icetImageGetColorub(result);
    local_2f0 = icetImageGetDepthf(result);
    local_2f8 = (IceTFloat *)0x0;
  }
  fVar26 = g_color[2];
  fVar25 = g_color[1];
  fVar24 = g_color[0];
  bVar23 = g_transparent;
  iVar29 = readback_viewport[1];
  local_2c8 = ZEXT416((uint)g_color[3]);
  iVar35 = iVar29;
  do {
    if (iVar29 + readback_viewport[3] <= iVar35) {
      if (g_first_render == '\x01') {
        if (g_sync_render == '\x01') {
          icetCommBarrier();
        }
        g_first_render = '\0';
      }
      return;
    }
    local_2d8 = ((double)iVar35 + (double)iVar35) / (double)screen_height + -1.0;
    iVar29 = *readback_viewport;
    for (lVar37 = (long)iVar29; IVar27 = screen_width,
        lVar37 < (long)iVar29 + (long)readback_viewport[2]; lVar37 = lVar37 + 1) {
      iVar38 = (int)lVar37;
      local_2d0 = ((double)iVar38 + (double)iVar38) / (double)screen_width + -1.0;
      uVar40 = SUB81(local_2d0,0);
      uVar41 = (undefined1)((ulong)local_2d0 >> 8);
      uVar42 = (undefined1)((ulong)local_2d0 >> 0x10);
      uVar43 = (undefined1)((ulong)local_2d0 >> 0x18);
      uVar44 = (undefined1)((ulong)local_2d0 >> 0x20);
      uVar45 = (undefined1)((ulong)local_2d0 >> 0x28);
      uVar46 = (undefined1)((ulong)local_2d0 >> 0x30);
      uVar48 = (undefined1)((ulong)local_2d0 >> 0x38);
      memcpy(local_178,&transformed_box,0xc0);
      uVar31 = CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(uVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40))))))) ^
               CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(uVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40)))))));
      uVar40 = (undefined1)uVar31;
      uVar41 = (undefined1)(uVar31 >> 8);
      uVar42 = (undefined1)(uVar31 >> 0x10);
      uVar43 = (undefined1)(uVar31 >> 0x18);
      uVar44 = (undefined1)(uVar31 >> 0x20);
      uVar45 = (undefined1)(uVar31 >> 0x28);
      uVar46 = (undefined1)(uVar31 >> 0x30);
      uVar48 = (undefined1)(uVar31 >> 0x38);
      pdVar33 = local_178 + 3;
      dVar11 = 2.0;
      uVar31 = 0xffffffffffffffff;
      for (uVar34 = 0; uVar34 != 6; uVar34 = uVar34 + 1) {
        dVar22 = ((pdVar33[-3] * local_2d0 + local_2d8 * pdVar33[-2]) - pdVar33[-1]) + *pdVar33;
        dVar55 = pdVar33[-3] * 0.0 + pdVar33[-2] * 0.0 + pdVar33[-1];
        if ((dVar55 != 0.0) || (NAN(dVar55))) {
          dVar22 = (double)((ulong)dVar22 ^ (ulong)DAT_00119850) / dVar55;
          if (dVar55 < 0.0) {
            if ((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(
                                                  uVar43,CONCAT12(uVar42,CONCAT11(uVar41,uVar40)))))
                                                )) <= dVar22 &&
                dVar22 != (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,
                                                  CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(uVar41,
                                                  uVar40)))))))) {
              uVar31 = uVar34 & 0xffffffff;
              uVar40 = SUB81(dVar22,0);
              uVar41 = (undefined1)((ulong)dVar22 >> 8);
              uVar42 = (undefined1)((ulong)dVar22 >> 0x10);
              uVar43 = (undefined1)((ulong)dVar22 >> 0x18);
              uVar44 = (undefined1)((ulong)dVar22 >> 0x20);
              uVar45 = (undefined1)((ulong)dVar22 >> 0x28);
              uVar46 = (undefined1)((ulong)dVar22 >> 0x30);
              uVar48 = (undefined1)((ulong)dVar22 >> 0x38);
            }
          }
          else if (dVar22 < dVar11) {
            dVar11 = dVar22;
          }
        }
        else if (0.0 < dVar22) goto LAB_00108518;
        pdVar33 = pdVar33 + 4;
      }
      if ((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(uVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40))))))) <=
          dVar11 && dVar11 != (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(
                                                  uVar44,CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(
                                                  uVar41,uVar40)))))))) {
        iVar30 = (int)uVar31;
        dVar22 = (double)transformed_box.planes[iVar30][2];
        dVar55 = (double)transformed_box.planes[iVar30][0];
        dVar2 = (double)transformed_box.planes[iVar30][1];
        fVar53 = (float)((double)((ulong)dVar22 ^ (ulong)DAT_00119850) /
                        SQRT(dVar22 * dVar22 + dVar55 * dVar55 + dVar2 * dVar2));
        IVar51 = (IceTFloat)(fVar24 * fVar53);
        IVar56 = (IceTFloat)(fVar25 * fVar53);
        IVar54 = (IceTFloat)(fVar53 * fVar26);
        if ((bVar23 & 1) == 0) {
          IVar39 = (IceTFloat)
                   (float)((double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,
                                                  CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(uVar41,
                                                  uVar40))))))) * 0.5);
          IVar52 = (IceTFloat)local_2c8._0_4_;
          goto LAB_00108609;
        }
        dVar11 = (dVar11 - (double)CONCAT17(uVar48,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,
                                                  CONCAT13(uVar43,CONCAT12(uVar42,CONCAT11(uVar41,
                                                  uVar40)))))))) * 4.0;
        lVar32 = (long)(int)(dVar11 * 1024.0);
        if (4.0 <= dVar11) {
          lVar32 = 0x1000;
        }
        fVar53 = (float)(double)g_opacity_lookup[lVar32];
        IVar51 = (IceTFloat)((float)IVar51 * fVar53);
        IVar56 = (IceTFloat)((float)IVar56 * fVar53);
        IVar54 = (IceTFloat)((float)IVar54 * fVar53);
        IVar52 = (IceTFloat)((float)local_2c8._0_4_ * fVar53);
LAB_001085ec:
        pIVar1 = local_2f8 + (IVar27 * iVar35 + iVar38) * 4;
        *pIVar1 = IVar51;
        pIVar1[1] = IVar56;
        pIVar1[2] = IVar54;
        pIVar1[3] = IVar52;
      }
      else {
LAB_00108518:
        IVar51 = *local_2e0;
        IVar56 = local_2e0[1];
        IVar54 = local_2e0[2];
        IVar52 = local_2e0[3];
        IVar39 = 1.0;
        if ((bVar23 & 1) != 0) goto LAB_001085ec;
LAB_00108609:
        iVar36 = IVar27 * iVar35;
        iVar29 = (int)((float)IVar51 * 255.0);
        iVar30 = (int)((float)IVar56 * 255.0);
        cVar47 = (char)((uint)iVar30 >> 0x10);
        iVar20 = (int)((float)IVar54 * 255.0);
        cVar49 = (char)((uint)iVar20 >> 0x10);
        iVar21 = (int)((float)IVar52 * 255.0);
        cVar50 = (char)((uint)iVar21 >> 0x10);
        uVar13 = CONCAT15((char)((uint)iVar30 >> 8),CONCAT14((char)iVar30,iVar29));
        uVar14 = CONCAT17((char)((uint)iVar30 >> 0x18),CONCAT16(cVar47,uVar13));
        Var15 = CONCAT19((char)((uint)iVar20 >> 8),CONCAT18((char)iVar20,uVar14));
        auVar16[10] = cVar49;
        auVar16._0_10_ = Var15;
        auVar16[0xb] = (char)((uint)iVar20 >> 0x18);
        auVar17[0xc] = (char)iVar21;
        auVar17._0_12_ = auVar16;
        auVar17[0xd] = (char)((uint)iVar21 >> 8);
        auVar12[0xe] = cVar50;
        auVar12._0_14_ = auVar17;
        auVar12[0xf] = (char)((uint)iVar21 >> 0x18);
        sVar7 = (short)iVar29;
        cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar29 - (0xff < sVar7);
        sVar7 = (short)((uint)iVar29 >> 0x10);
        sVar8 = (short)((uint6)uVar13 >> 0x20);
        cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar30 - (0xff < sVar8);
        sVar8 = (short)((ulong)uVar14 >> 0x30);
        sVar9 = (short)((unkuint10)Var15 >> 0x40);
        cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar20 - (0xff < sVar9);
        sVar9 = auVar16._10_2_;
        sVar10 = auVar17._12_2_;
        cVar6 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar21 - (0xff < sVar10);
        sVar10 = auVar12._14_2_;
        sVar18 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar29 >> 0x10) -
                          (0xff < sVar7),cVar3);
        uVar19 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar47 - (0xff < sVar8),
                          CONCAT12(cVar4,sVar18));
        uVar13 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar49 - (0xff < sVar9),
                          CONCAT14(cVar5,uVar19));
        sVar7 = (short)((uint)uVar19 >> 0x10);
        sVar8 = (short)((uint6)uVar13 >> 0x20);
        sVar9 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar50 - (0xff < sVar10),
                                 CONCAT16(cVar6,uVar13)) >> 0x30);
        *(uint *)(local_2e8 + (long)(iVar36 + iVar38) * 4) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                        (0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18))))
        ;
        local_2f0[iVar36 + lVar37] = IVar39;
        iVar29 = *readback_viewport;
      }
    }
    iVar35 = iVar35 + 1;
    iVar29 = readback_viewport[1];
  } while( true );
}

Assistant:

static void draw(const IceTDouble *projection_matrix,
                 const IceTDouble *modelview_matrix,
                 const IceTFloat *background_color,
                 const IceTInt *readback_viewport,
                 IceTImage result)
{
    IceTUByte *color_buffer;
    IceTFloat *depth_buffer;
    IceTSizeType num_pixels;
    IceTSizeType i;

    /* Suppress compiler warnings. */
    (void)projection_matrix;
    (void)modelview_matrix;
    (void)background_color;
    (void)readback_viewport;

    num_pixels = icetImageGetNumPixels(result);

    color_buffer = icetImageGetColorub(result);
    for (i = 0; i < num_pixels*4; i++) {
        color_buffer[i] = 255;
    }

    depth_buffer = icetImageGetDepthf(result);
    for (i = 0; i < num_pixels; i++) {
        depth_buffer[i] = 0.5f;
    }
}